

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  string *local_40;
  string *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  string *loaderPath_local;
  string *executablePath_local;
  string *name_local;
  cmBinUtilsMacOSMachOLinker *this_local;
  
  *resolved = false;
  local_40 = path;
  path_local = (string *)rpaths;
  rpaths_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)loaderPath;
  loaderPath_local = executablePath;
  executablePath_local = name;
  name_local = (string *)this;
  bVar1 = cmHasLiteralPrefix<std::__cxx11::string,8ul>(name,(char (*) [8])"@rpath/");
  if (bVar1) {
    bVar1 = ResolveRPathDependency
                      (this,executablePath_local,loaderPath_local,(string *)rpaths_local,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)path_local,local_40,resolved);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                      (executablePath_local,(char (*) [14])"@loader_path/");
    if (bVar1) {
      bVar1 = ResolveLoaderPathDependency
                        (this,executablePath_local,(string *)rpaths_local,local_40,resolved);
      if (!bVar1) {
        return false;
      }
    }
    else {
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,18ul>
                        (executablePath_local,(char (*) [18])"@executable_path/");
      if (bVar1) {
        bVar1 = ResolveExecutablePathDependency
                          (this,executablePath_local,loaderPath_local,local_40,resolved);
        if (!bVar1) {
          return false;
        }
      }
      else {
        *resolved = true;
        std::__cxx11::string::operator=((string *)local_40,(string *)executablePath_local);
      }
    }
  }
  if (((*resolved & 1U) == 0) || (bVar1 = cmsys::SystemTools::FileIsFullPath(local_40), bVar1)) {
    this_local._7_1_ = true;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Resolved path is not absolute",&local_61);
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  resolved = false;
  if (cmHasLiteralPrefix(name, "@rpath/")) {
    if (!this->ResolveRPathDependency(name, executablePath, loaderPath, rpaths,
                                      path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@loader_path/")) {
    if (!this->ResolveLoaderPathDependency(name, loaderPath, path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@executable_path/")) {
    if (!this->ResolveExecutablePathDependency(name, executablePath, path,
                                               resolved)) {
      return false;
    }
  } else {
    resolved = true;
    path = name;
  }

  if (resolved && !cmSystemTools::FileIsFullPath(path)) {
    this->SetError("Resolved path is not absolute");
    return false;
  }

  return true;
}